

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QMainWindowLayout::~QMainWindowLayout(QMainWindowLayout *this)

{
  QArrayData *pQVar1;
  long lVar2;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  QArrayDataPointer<QDockAreaLayoutItem> *pQVar6;
  long lVar7;
  
  *(undefined ***)this = &PTR_metaObject_007f5148;
  *(undefined ***)(this + 0x10) = &PTR__QMainWindowLayout_007f5250;
  QToolBarAreaLayout::deleteAllLayoutItems((QToolBarAreaLayout *)(this + 0xa0));
  QDockAreaLayout::deleteAllLayoutItems((QDockAreaLayout *)(this + 0x1a0));
  if (*(long **)(this + 0x1c0) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x1c0) + 8))();
  }
  *(undefined8 *)(this + 0x1c0) = 0;
  if (*(long **)(this + 0x708) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x708) + 8))();
  }
  pQVar1 = *(QArrayData **)(this + 0x720);
  lVar7 = *(long *)(this + 0x728);
  *(undefined8 *)(this + 0x720) = 0;
  *(undefined8 *)(this + 0x728) = 0;
  lVar2 = *(long *)(this + 0x730);
  *(undefined8 *)(this + 0x730) = 0;
  if (lVar2 != 0) {
    lVar5 = 0;
    do {
      if (*(long **)(lVar7 + lVar5) != (long *)0x0) {
        (**(code **)(**(long **)(lVar7 + lVar5) + 0x20))();
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,0x10);
    }
  }
  piVar3 = *(int **)(this + 0x7f0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      pvVar4 = *(void **)(this + 0x7f0);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = (void *)0x0;
      }
      operator_delete(pvVar4);
    }
  }
  piVar3 = *(int **)(this + 0x7e0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      pvVar4 = *(void **)(this + 0x7e0);
      if (pvVar4 == (void *)0x0) {
        pvVar4 = (void *)0x0;
      }
      operator_delete(pvVar4);
    }
  }
  piVar3 = *(int **)(this + 0x7b0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x7b0),4,0x10);
    }
  }
  *(undefined ***)(this + 0x790) = &PTR_metaObject_007eb520;
  QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::~QHash
            ((QHash<QWidget_*,_QPointer<QPropertyAnimation>_> *)(this + 0x7a0));
  QObject::~QObject((QObject *)(this + 0x790));
  if (*(int *)(this + 0x778) != 0) {
    QBasicTimer::stop();
  }
  piVar3 = *(int **)(this + 0x748);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x748),8,0x10);
    }
  }
  QHash<QWidget_*,_QHashDummyValue>::~QHash((QHash<QWidget_*,_QHashDummyValue> *)(this + 0x740));
  piVar3 = *(int **)(this + 0x720);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x720),8,0x10);
    }
  }
  QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718));
  if (*(QMainWindowLayoutState **)(this + 0x6f8) != (QMainWindowLayoutState *)0x0) {
    std::default_delete<QMainWindowLayoutState>::operator()
              ((default_delete<QMainWindowLayoutState> *)(this + 0x6f8),
               *(QMainWindowLayoutState **)(this + 0x6f8));
  }
  *(undefined8 *)(this + 0x6f8) = 0;
  piVar3 = *(int **)(this + 0x6e0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x6e0),8,0x10);
    }
  }
  pQVar6 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + 0x6a8);
  lVar7 = -0x1c0;
  do {
    QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(pQVar6);
    piVar3 = (int *)pQVar6[-3].size;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)pQVar6[-3].size,8,0x10);
      }
    }
    pQVar6 = (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar6[-5].ptr;
    lVar7 = lVar7 + 0x70;
  } while (lVar7 != 0);
  lVar7 = 0x498;
  do {
    QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + lVar7));
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != 0x3b8);
  piVar3 = *(int **)(this + 0x3a8);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x3a8),8,0x10);
    }
  }
  pQVar6 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + 0x370);
  lVar7 = -0x1c0;
  do {
    QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(pQVar6);
    piVar3 = (int *)pQVar6[-3].size;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)pQVar6[-3].size,8,0x10);
      }
    }
    pQVar6 = (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar6[-5].ptr;
    lVar7 = lVar7 + 0x70;
  } while (lVar7 != 0);
  lVar7 = 0x160;
  do {
    QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + lVar7));
    lVar7 = lVar7 + -0x38;
  } while (lVar7 != 0x80);
  if (*(int *)(this + 0x80) != 0) {
    QBasicTimer::stop();
  }
  piVar3 = *(int **)(this + 0x58);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x58),4,0x10);
    }
  }
  QCursor::~QCursor((QCursor *)(this + 0x48));
  QCursor::~QCursor((QCursor *)(this + 0x40));
  piVar3 = *(int **)(this + 0x20);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x20),4,0x10);
    }
  }
  QLayout::~QLayout((QLayout *)this);
  return;
}

Assistant:

QMainWindowLayout::~QMainWindowLayout()
{
    layoutState.deleteAllLayoutItems();
    layoutState.deleteCentralWidgetItem();

    delete statusbar;

#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    // unusedTabBars contains unparented tab bars, which need to be removed manually.
    // ~QMainWindowTabBar() attempts to remove the bar from unusedTabBars
    // => move it out of the way first.
    const auto bars = std::move(unusedTabBars);
    qDeleteAll(bars);
#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
}